

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool mkvmuxer::anon_unknown_12::StrCpy(char *src,char **dst_ptr)

{
  size_t __n;
  char *__dest;
  
  if (dst_ptr != (char **)0x0) {
    if (*dst_ptr != (char *)0x0) {
      operator_delete__(*dst_ptr);
    }
    *dst_ptr = (char *)0x0;
    if (src == (char *)0x0) {
      return true;
    }
    __n = strlen(src);
    __dest = (char *)operator_new__(__n + 1,(nothrow_t *)&std::nothrow);
    *dst_ptr = __dest;
    if (__dest != (char *)0x0) {
      memcpy(__dest,src,__n);
      __dest[__n] = '\0';
      return true;
    }
  }
  return false;
}

Assistant:

bool StrCpy(const char* src, char** dst_ptr) {
  if (dst_ptr == NULL)
    return false;

  char*& dst = *dst_ptr;

  delete[] dst;
  dst = NULL;

  if (src == NULL)
    return true;

  const size_t size = strlen(src) + 1;

  dst = new (std::nothrow) char[size];  // NOLINT
  if (dst == NULL)
    return false;

  memcpy(dst, src, size - 1);
  dst[size - 1] = '\0';
  return true;
}